

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapLiberty.c
# Opt level: O0

Vec_Ptr_t * Amap_LibertyCellOutputs(Amap_Tree_t *p,Amap_Item_t *pCell)

{
  int iVar1;
  Vec_Ptr_t *p_00;
  Amap_Item_t *pAVar2;
  Vec_Ptr_t *vOutPins;
  Amap_Item_t *pPin;
  Amap_Item_t *pCell_local;
  Amap_Tree_t *p_local;
  
  p_00 = Vec_PtrAlloc(2);
  for (vOutPins = (Vec_Ptr_t *)Amap_LibertyItem(p,pCell->Child); vOutPins != (Vec_Ptr_t *)0x0;
      vOutPins = (Vec_Ptr_t *)Amap_LibertyItem(p,vOutPins[2].nCap)) {
    iVar1 = Amap_LibertyCompare(p,(Amap_Pair_t)vOutPins->pArray,"pin");
    if ((iVar1 == 0) &&
       (pAVar2 = Amap_LibertyPinFunction(p,(Amap_Item_t *)vOutPins), pAVar2 != (Amap_Item_t *)0x0))
    {
      Vec_PtrPush(p_00,vOutPins);
    }
  }
  return p_00;
}

Assistant:

Vec_Ptr_t * Amap_LibertyCellOutputs( Amap_Tree_t * p, Amap_Item_t * pCell )
{
    Amap_Item_t * pPin;
    Vec_Ptr_t * vOutPins;
    vOutPins = Vec_PtrAlloc( 2 );
    Amap_ItemForEachChild( p, pCell, pPin )
    {
        if ( Amap_LibertyCompare(p, pPin->Key, "pin") )
            continue;
        if ( Amap_LibertyPinFunction(p, pPin) )
            Vec_PtrPush( vOutPins, pPin );
    }
    return vOutPins;
}